

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O1

void __thiscall
rapidjson::internal::
GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GenericRegexSearch
          (GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           *this,GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *regex,
          CrtAllocator *allocator)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  CrtAllocator *pCVar4;
  uint32_t *puVar5;
  long lVar6;
  ulong count;
  
  this->regex_ = regex;
  this->allocator_ = allocator;
  this->ownAllocator_ = (CrtAllocator *)0x0;
  (this->state0_).allocator_ = allocator;
  (this->state0_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->state0_).stack_ = (char *)0x0;
  (this->state0_).stackTop_ = (char *)0x0;
  (this->state0_).stackEnd_ = (char *)0x0;
  (this->state0_).initialCapacity_ = 0;
  (this->state1_).allocator_ = allocator;
  (this->state1_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->state1_).stack_ = (char *)0x0;
  (this->state1_).stackTop_ = (char *)0x0;
  (this->state1_).stackEnd_ = (char *)0x0;
  (this->state1_).initialCapacity_ = 0;
  this->stateSet_ = (uint32_t *)0x0;
  if (regex->root_ != 0xffffffff) {
    if (allocator == (CrtAllocator *)0x0) {
      pCVar4 = (CrtAllocator *)operator_new(1);
      this->allocator_ = pCVar4;
      this->ownAllocator_ = pCVar4;
    }
    uVar2 = regex->stateCount_;
    uVar3 = uVar2 + 0x1f >> 3 & 0x1ffffffc;
    if (uVar3 == 0) {
      puVar5 = (uint32_t *)0x0;
    }
    else {
      puVar5 = (uint32_t *)malloc((ulong)uVar3);
    }
    this->stateSet_ = puVar5;
    lVar1 = (ulong)uVar2 * 4;
    lVar6 = (long)(this->state0_).stackEnd_ - (long)(this->state0_).stackTop_;
    if (lVar1 - lVar6 != 0 && lVar6 <= lVar1) {
      Stack<rapidjson::CrtAllocator>::Expand<unsigned_int>(&this->state0_,(ulong)uVar2);
    }
    count = (ulong)this->regex_->stateCount_;
    lVar1 = count * 4;
    lVar6 = (long)(this->state1_).stackEnd_ - (long)(this->state1_).stackTop_;
    if (lVar1 - lVar6 != 0 && lVar6 <= lVar1) {
      Stack<rapidjson::CrtAllocator>::Expand<unsigned_int>(&this->state1_,count);
    }
    return;
  }
  __assert_fail("regex_.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                ,0x267,
                "rapidjson::internal::GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<>>>::GenericRegexSearch(const RegexType &, Allocator *) [RegexType = rapidjson::internal::GenericRegex<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

GenericRegexSearch(const RegexType& regex, Allocator* allocator = 0) : 
        regex_(regex), allocator_(allocator), ownAllocator_(0),
        state0_(allocator, 0), state1_(allocator, 0), stateSet_()
    {
        RAPIDJSON_ASSERT(regex_.IsValid());
        if (!allocator_)
            ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();
        stateSet_ = static_cast<uint32_t*>(allocator_->Malloc(GetStateSetSize()));
        state0_.template Reserve<SizeType>(regex_.stateCount_);
        state1_.template Reserve<SizeType>(regex_.stateCount_);
    }